

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall APlayerPawn::Die(APlayerPawn *this,AActor *source,AActor *inflictor,int dmgflags)

{
  byte *pbVar1;
  player_t *ppVar2;
  AWeapon *this_00;
  FState *pFVar3;
  AAmmo *pAVar4;
  bool bVar5;
  int iVar6;
  undefined8 in_RAX;
  DDropItem *pDVar7;
  PClass *p;
  PClassActor *pPVar8;
  undefined4 extraout_var;
  AInventory *pAVar9;
  undefined8 local_28;
  
  local_28 = in_RAX;
  AActor::Die(&this->super_AActor,source,inflictor,dmgflags);
  ppVar2 = (this->super_AActor).player;
  if (ppVar2 != (player_t *)0x0) {
    if (ppVar2->mo != this) {
      AActor::CallDie(&ppVar2->mo->super_AActor,source,inflictor,dmgflags);
      return;
    }
    ppVar2->bonuscount = 0;
    if ((((byte)dmflags2.Value & 2) != 0) &&
       (this_00 = ppVar2->ReadyWeapon, this_00 != (AWeapon *)0x0)) {
      pDVar7 = AActor::GetDropItems((AActor *)this_00);
      if (pDVar7 == (DDropItem *)0x0) {
        pFVar3 = (this_00->super_AStateProvider).super_AInventory.super_AActor.SpawnState;
        if ((pFVar3 == (FState *)0x0) ||
           (pFVar3 == *(FState **)((AActor::RegistrationInfo.MyClass)->Defaults + 0x448))) {
          pAVar9 = P_DropItem(&this->super_AActor,(PClassActor *)this_00->AmmoType1,-1,0x100);
          if (pAVar9 != (AInventory *)0x0) {
            pAVar9->Amount = (((this_00->Ammo1).field_0.p)->super_AInventory).Amount;
            pbVar1 = (byte *)((long)&pAVar9->ItemFlags + 1);
            *pbVar1 = *pbVar1 | 0x40;
          }
          pAVar9 = P_DropItem(&this->super_AActor,(PClassActor *)this_00->AmmoType2,-1,0x100);
          if (pAVar9 == (AInventory *)0x0) goto LAB_00468824;
          pAVar9->Amount = (((this_00->Ammo2).field_0.p)->super_AInventory).Amount;
        }
        else {
          pPVar8 = (PClassActor *)
                   (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject.Class;
          if (pPVar8 == (PClassActor *)0x0) {
            iVar6 = (**(this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject._vptr_DObject)(this_00);
            pPVar8 = (PClassActor *)CONCAT44(extraout_var,iVar6);
            (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject.Class = (PClass *)pPVar8;
          }
          pAVar9 = P_DropItem(&this->super_AActor,pPVar8,-1,0x100);
          if ((pAVar9 == (AInventory *)0x0) ||
             (bVar5 = DObject::IsKindOf((DObject *)pAVar9,AWeapon::RegistrationInfo.MyClass), !bVar5
             )) goto LAB_00468824;
          if ((this_00->AmmoGive1 != 0) &&
             (pAVar4 = (this_00->Ammo1).field_0.p, pAVar4 != (AAmmo *)0x0)) {
            if (((pAVar4->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
                0x20) == 0) {
              *(int *)&pAVar9[1].super_AActor.super_DThinker.super_DObject.ObjNext =
                   (pAVar4->super_AInventory).Amount;
            }
            else {
              (this_00->Ammo1).field_0.p = (AAmmo *)0x0;
            }
          }
          if ((this_00->AmmoGive2 != 0) &&
             (pAVar4 = (this_00->Ammo2).field_0.p, pAVar4 != (AAmmo *)0x0)) {
            if (((pAVar4->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
                0x20) == 0) {
              *(int *)((long)&pAVar9[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
                   (pAVar4->super_AInventory).Amount;
            }
            else {
              (this_00->Ammo2).field_0.p = (AAmmo *)0x0;
            }
          }
        }
        pbVar1 = (byte *)((long)&pAVar9->ItemFlags + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      else {
        do {
          iVar6 = (pDVar7->Name).Index;
          if (iVar6 != 0) {
            local_28 = CONCAT44(local_28._4_4_,iVar6);
            p = PClass::FindClass((FName *)&local_28);
            pPVar8 = dyn_cast<PClassActor>((DObject *)p);
            if (pPVar8 != (PClassActor *)0x0) {
              P_DropItem(&((this->super_AActor).player)->mo->super_AActor,pPVar8,pDVar7->Amount,
                         pDVar7->Probability);
            }
          }
          pDVar7 = pDVar7->Next;
        } while (pDVar7 != (DDropItem *)0x0);
      }
    }
  }
LAB_00468824:
  if ((multiplayer == false) && (iVar6 = ((level.info)->deathsequence).Index, iVar6 != 0)) {
    local_28 = CONCAT44(iVar6,local_28._0_4_);
    F_StartIntermission((FName *)((long)&local_28 + 4),'\0');
  }
  return;
}

Assistant:

void APlayerPawn::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	Super::Die (source, inflictor, dmgflags);

	if (player != NULL && player->mo == this) player->bonuscount = 0;

	if (player != NULL && player->mo != this)
	{ // Make the real player die, too
		player->mo->CallDie (source, inflictor, dmgflags);
	}
	else
	{
		if (player != NULL && (dmflags2 & DF2_YES_WEAPONDROP))
		{ // Voodoo dolls don't drop weapons
			AWeapon *weap = player->ReadyWeapon;
			if (weap != NULL)
			{
				AInventory *item;

				// kgDROP - start - modified copy from a_action.cpp
				DDropItem *di = weap->GetDropItems();

				if (di != NULL)
				{
					while (di != NULL)
					{
						if (di->Name != NAME_None)
						{
							PClassActor *ti = PClass::FindActor(di->Name);
							if (ti) P_DropItem (player->mo, ti, di->Amount, di->Probability);
						}
						di = di->Next;
					}
				} else
				// kgDROP - end
				if (weap->SpawnState != NULL &&
					weap->SpawnState != ::GetDefault<AActor>()->SpawnState)
				{
					item = P_DropItem (this, weap->GetClass(), -1, 256);
					if (item != NULL && item->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (weap->AmmoGive1 && weap->Ammo1)
						{
							static_cast<AWeapon *>(item)->AmmoGive1 = weap->Ammo1->Amount;
						}
						if (weap->AmmoGive2 && weap->Ammo2)
						{
							static_cast<AWeapon *>(item)->AmmoGive2 = weap->Ammo2->Amount;
						}
						item->ItemFlags |= IF_IGNORESKILL;
					}
				}
				else
				{
					item = P_DropItem (this, weap->AmmoType1, -1, 256);
					if (item != NULL)
					{
						item->Amount = weap->Ammo1->Amount;
						item->ItemFlags |= IF_IGNORESKILL;
					}
					item = P_DropItem (this, weap->AmmoType2, -1, 256);
					if (item != NULL)
					{
						item->Amount = weap->Ammo2->Amount;
						item->ItemFlags |= IF_IGNORESKILL;
					}
				}
			}
		}
		if (!multiplayer && level.info->deathsequence != NAME_None)
		{
			F_StartIntermission(level.info->deathsequence, FSTATE_EndingGame);
		}
	}
}